

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  undefined4 local_24;
  int local_20;
  int yes;
  int r;
  uv_os_sock_t sock;
  sockaddr_in bind_addr_local;
  
  bind_addr_local._0_8_ = bind_addr.sin_zero;
  _r = bind_addr._0_8_;
  yes = socket(2,1,0);
  if (yes < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x6f,"sock >= 0");
    abort();
  }
  local_24 = 1;
  local_20 = setsockopt(yes,1,2,&local_24,4);
  if (local_20 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x77,"r == 0");
    abort();
  }
  local_20 = bind(yes,(sockaddr *)&r,0x10);
  if (local_20 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c"
            ,0x7c,"r == 0");
    abort();
  }
  return yes;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT(r == 0);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT(r == 0);

  return sock;
}